

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.h
# Opt level: O3

void __thiscall LTFlightData::FDKeyTy::FDKeyTy(FDKeyTy *this,FDKeyType _eType,string *_key,int base)

{
  pointer pcVar1;
  string local_68;
  string local_48;
  
  this->eKeyType = KEY_UNKNOWN;
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  (this->key)._M_string_length = 0;
  (this->key).field_2._M_local_buf[0] = '\0';
  this->num = 0;
  pcVar1 = (_key->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + _key->_M_string_length);
  SetKey(&local_48,this,_eType,&local_68,base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

FDKeyTy(FDKeyType _eType, const std::string _key, int base=16)  { SetKey(_eType, _key, base); }